

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

ctmbstr ExpandTilde(TidyDocImpl *doc,ctmbstr filename)

{
  ctmbstr __src;
  long lVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  passwd *ppVar6;
  ctmbstr str;
  size_t __n;
  
  if (filename == (ctmbstr)0x0) {
    filename = (tmbstr)0x0;
  }
  else if (*filename == '~') {
    __src = filename + 1;
    cVar2 = filename[1];
    if (cVar2 == '/') {
      pcVar5 = getenv("HOME");
      str = filename;
      if (pcVar5 != (char *)0x0) {
        str = __src;
      }
    }
    else {
      __n = 0;
      while ((cVar2 != '\0' && (cVar2 != '/'))) {
        lVar1 = __n + 2;
        __n = __n + 1;
        cVar2 = filename[lVar1];
      }
      pcVar5 = (char *)(*doc->allocator->vtbl->alloc)(doc->allocator,__n + 1);
      if (pcVar5 == (char *)0x0) {
        return filename;
      }
      memcpy(pcVar5,__src,__n);
      pcVar5[__n] = '\0';
      ppVar6 = getpwnam(pcVar5);
      (*doc->allocator->vtbl->free)(doc->allocator,pcVar5);
      if (ppVar6 == (passwd *)0x0) {
        return filename;
      }
      pcVar5 = ppVar6->pw_dir;
      str = __src + __n;
    }
    filename = str;
    if (pcVar5 != (ctmbstr)0x0) {
      uVar3 = prvTidytmbstrlen(str);
      uVar4 = prvTidytmbstrlen(pcVar5);
      filename = (ctmbstr)(*doc->allocator->vtbl->alloc)
                                    (doc->allocator,(long)uVar3 + (long)uVar4 + 1);
      prvTidytmbstrcpy(filename,pcVar5);
      prvTidytmbstrcat(filename,str);
    }
  }
  return filename;
}

Assistant:

static ctmbstr ExpandTilde( TidyDocImpl* doc, ctmbstr filename )
{
    char *home_dir = NULL;

    if ( !filename )
        return NULL;

    if ( filename[0] != '~' )
        return filename;

    if (filename[1] == '/')
    {
        home_dir = getenv("HOME");
        if (home_dir) {
            ++filename;
        }
#ifdef _WIN32
        else if (strlen(filename) >= 3) {   /* at least '~/+1' */
            /* no HOME env in Windows - got for HOMEDRIVE=C: HOMEPATH=\Users\user */
            char * hd = getenv("HOMEDRIVE");
            char * hp = getenv("HOMEPATH");
            if (hd && hp) {
                ctmbstr s = TidyDocAlloc(doc, _MAX_PATH);
                strcpy(s, hd);
                strcat(s, hp);
                strcat(s, "\\");
                strcat(s, &filename[2]);
                return s;
            }

        }
#endif /* _WIN32 */

    }
#ifdef SUPPORT_GETPWNAM
    else
    {
        struct passwd *passwd = NULL;
        ctmbstr s = filename + 1;
        tmbstr t;

        while ( *s && *s != '/' )
            s++;

        if ( (t = TidyDocAlloc(doc, s - filename)) )
        {
            memcpy(t, filename+1, s-filename-1);
            t[s-filename-1] = 0;

            passwd = getpwnam(t);

            TidyDocFree(doc, t);
        }

        if ( passwd )
        {
            filename = s;
            home_dir = passwd->pw_dir;
        }
    }
#endif /* SUPPORT_GETPWNAM */

    if ( home_dir )
    {
        uint len = TY_(tmbstrlen)(filename) + TY_(tmbstrlen)(home_dir) + 1;
        tmbstr p = (tmbstr)TidyDocAlloc( doc, len );
        TY_(tmbstrcpy)( p, home_dir );
        TY_(tmbstrcat)( p, filename );
        return (ctmbstr) p;
    }
    return (ctmbstr) filename;
}